

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O3

void secp256k1_scratch_space_destroy(secp256k1_context *ctx,secp256k1_scratch_space *scratch)

{
  long lVar1;
  
  if (scratch == (secp256k1_scratch_space *)0x0) {
    return;
  }
  lVar1 = 0;
  do {
    if (scratch->magic[lVar1] != "scratch"[lVar1]) {
      (*(ctx->error_callback).fn)("invalid scratch space",(ctx->error_callback).data);
      return;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  free(scratch);
  return;
}

Assistant:

static void secp256k1_scratch_destroy(const secp256k1_callback* error_callback, secp256k1_scratch* scratch) {
    if (scratch != NULL) {
        if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
            secp256k1_callback_call(error_callback, "invalid scratch space");
            return;
        }
        VERIFY_CHECK(scratch->alloc_size == 0); /* all checkpoints should be applied */
        memset(scratch->magic, 0, sizeof(scratch->magic));
        free(scratch);
    }
}